

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlFreeObjectTree(JlDataObject **pRootObject)

{
  JlDataObject *Memory;
  JL_STATUS JVar1;
  JlDictionaryItem *Memory_00;
  JlDictionaryItem *Memory_01;
  
  if (pRootObject == (JlDataObject **)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  Memory = *pRootObject;
  if (Memory == (JlDataObject *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  JVar1 = JL_STATUS_SUCCESS;
  switch(Memory->Type) {
  case JL_DATA_TYPE_STRING:
    if ((Memory->field_2).String != (char *)0x0) {
      WjTestLib_Free((Memory->field_2).String);
      (Memory->field_2).String = (char *)0x0;
    }
    break;
  case JL_DATA_TYPE_NUMBER:
  case JL_DATA_TYPE_BOOL:
    break;
  case JL_DATA_TYPE_LIST:
    Memory_01 = (JlDictionaryItem *)((long)&Memory->field_2 + 8);
    Memory_00 = (JlDictionaryItem *)0x0;
    do {
      Memory_01 = Memory_01->Next;
      if (Memory_01 == (JlDictionaryItem *)0x0) goto LAB_00102284;
      if (Memory_00 != (JlDictionaryItem *)0x0) {
        WjTestLib_Free(Memory_00);
      }
      JVar1 = JlFreeObjectTree((JlDataObject **)&Memory_01->KeyName);
      Memory_01->KeyName = (char *)0x0;
      Memory_00 = Memory_01;
    } while (JVar1 == JL_STATUS_SUCCESS);
    goto LAB_00102287;
  case JL_DATA_TYPE_DICTIONARY:
    Memory_01 = (JlDictionaryItem *)&Memory->field_2;
    Memory_00 = (JlDictionaryItem *)0x0;
    do {
      Memory_01 = Memory_01->Next;
      if (Memory_01 == (JlDictionaryItem *)0x0) goto LAB_00102284;
      if (Memory_00 != (JlDictionaryItem *)0x0) {
        WjTestLib_Free(Memory_00);
      }
      WjTestLib_Free(Memory_01->KeyName);
      Memory_01->KeyName = (char *)0x0;
      JVar1 = JlFreeObjectTree(&Memory_01->Object);
      Memory_00 = Memory_01;
    } while (JVar1 == JL_STATUS_SUCCESS);
LAB_00102287:
    if (Memory_01 != (JlDictionaryItem *)0x0) {
      WjTestLib_Free(Memory_01);
    }
    break;
  default:
    JVar1 = JL_STATUS_CORRUPT_MEMORY;
  }
  WjTestLib_Free(Memory);
  *pRootObject = (JlDataObject *)0x0;
  return JVar1;
LAB_00102284:
  JVar1 = JL_STATUS_SUCCESS;
  Memory_01 = Memory_00;
  goto LAB_00102287;
}

Assistant:

JL_STATUS
    JlFreeObjectTree
    (
        JlDataObject**              pRootObject
    )
{
    JL_STATUS jlStatus;
    JL_DATA_TYPE objectType = JL_DATA_TYPE_NONE;

    if(     NULL != pRootObject
        &&  NULL != *pRootObject )
    {
        JlDataObject* object = *pRootObject;

        objectType = JlGetObjectType( object );
        switch( objectType )
        {
        case JL_DATA_TYPE_STRING:
            if( NULL != object->String )
            {
                JlFree( object->String );
                object->String = NULL;
            }
            jlStatus = JL_STATUS_SUCCESS;
            break;
        case JL_DATA_TYPE_NUMBER:
        case JL_DATA_TYPE_BOOL:
            jlStatus = JL_STATUS_SUCCESS;
            break;
        case JL_DATA_TYPE_DICTIONARY:
        {
            JlDictionaryItem* prevDictionaryItem = NULL;
            jlStatus = JL_STATUS_SUCCESS;
            for( JlDictionaryItem* dictionaryItem=object->Dictionary.DictionaryHead; dictionaryItem!=NULL; dictionaryItem=dictionaryItem->Next )
            {
                if( NULL != prevDictionaryItem )
                {
                    JlFree( prevDictionaryItem );
                    prevDictionaryItem = NULL;
                }
                JlFree( dictionaryItem->KeyName );
                dictionaryItem->KeyName = NULL;
                jlStatus = JlFreeObjectTree( &dictionaryItem->Object );
                prevDictionaryItem = dictionaryItem;
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    break;
                }
            }
            if( NULL != prevDictionaryItem )
            {
                JlFree( prevDictionaryItem );
                prevDictionaryItem = NULL;
            }
            break;
        }
        case JL_DATA_TYPE_LIST:
        {
            JlListItem* prevListItem = NULL;
            jlStatus = JL_STATUS_SUCCESS;
            for( JlListItem* listItem=object->List.ListHead; listItem!=NULL; listItem=listItem->Next )
            {
                if( NULL != prevListItem )
                {
                    JlFree( prevListItem );
                    prevListItem = NULL;
                }
                jlStatus = JlFreeObjectTree( &listItem->Object );
                listItem->Object = NULL;
                prevListItem = listItem;
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    break;
                }
            }
            if( NULL != prevListItem )
            {
                JlFree( prevListItem );
                prevListItem = NULL;
            }
            break;
        }
        default:
            jlStatus = JL_STATUS_CORRUPT_MEMORY;
            break;
        }

        // Now free the object container
        JlFree( object );
        object = NULL;
        *pRootObject = NULL;
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}